

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

int Inv(double *src,double (*dst) [4],double *determinant,double *pivot)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [8];
  undefined8 uVar15;
  int iVar16;
  undefined8 *puVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  bool bVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  ulong uVar29;
  double dVar30;
  undefined4 uVar31;
  double t;
  undefined4 uVar32;
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  undefined1 auVar43 [16];
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  double dVar49;
  undefined1 local_128 [8];
  double dStack_120;
  undefined1 local_118 [8];
  double dStack_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined8 local_a8;
  undefined8 uStack_a0;
  double adStack_98 [4];
  double dStack_78;
  double dStack_70;
  double local_68 [4];
  double local_48 [2];
  undefined1 auStack_38 [16];
  
  puVar17 = &local_a8;
  uVar28 = 0;
  *pivot = 0.0;
  *determinant = 0.0;
  local_c8 = ZEXT816(0);
  local_e8 = ZEXT816(0);
  local_f8 = ZEXT816(0);
  _local_118 = ZEXT816(0);
  local_b8 = ZEXT816(0x3ff0000000000000) << 0x40;
  local_d8 = ZEXT816(0x3ff0000000000000);
  local_108 = ZEXT816(0x3ff0000000000000) << 0x40;
  _local_128 = ZEXT816(0x3ff0000000000000);
  pdVar20 = (double *)&local_a8;
  for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
    *pdVar20 = *src;
    src = src + 1;
    pdVar20 = pdVar20 + 1;
  }
  uVar31 = SUB84(local_a8,0);
  uVar32 = (undefined4)((ulong)local_a8 >> 0x20);
  dVar30 = ABS(local_a8);
  uVar24 = 0;
  uVar29 = 0;
  do {
    uVar26 = 0;
    do {
      if (dVar30 < ABS(*(double *)((long)puVar17 + uVar26 * 8))) {
        uVar29 = uVar28 & 0xffffffff;
        uVar24 = uVar26 & 0xffffffff;
        dVar30 = ABS(*(double *)((long)puVar17 + uVar26 * 8));
      }
      uVar26 = uVar26 + 1;
    } while (uVar26 != 4);
    uVar28 = uVar28 + 1;
    puVar17 = (undefined8 *)((long)puVar17 + 0x20);
  } while (uVar28 != 4);
  *pivot = dVar30;
  iVar21 = (int)uVar29;
  if (iVar21 == 0) {
    auVar35 = ZEXT816(0);
    auVar38 = ZEXT816(0x3ff0000000000000);
  }
  else {
    lVar22 = (long)iVar21;
    lVar18 = lVar22 * 0x20;
    uVar11 = CONCAT44(uStack_a0._4_4_,(undefined4)uStack_a0);
    uVar31 = *(undefined4 *)(&local_a8 + lVar22 * 4);
    uVar32 = *(undefined4 *)((long)&local_a8 + lVar18 + 4);
    uVar9 = *(undefined4 *)((long)&uStack_a0 + lVar22 * 8 * 4);
    uVar10 = *(undefined4 *)((long)adStack_98 + lVar18 + -4);
    (&local_a8)[lVar22 * 4] = local_a8;
    dVar36 = adStack_98[1];
    local_a8 = (double)CONCAT44(uVar32,uVar31);
    uStack_a0._0_4_ = uVar9;
    uStack_a0._4_4_ = uVar10;
    dVar33 = adStack_98[lVar22 * 4];
    dVar42 = adStack_98[lVar22 * 4 + 1];
    *(undefined8 *)((long)&uStack_a0 + lVar22 * 8 * 4) = uVar11;
    adStack_98[lVar22 * 4] = adStack_98[0];
    adStack_98[0] = dVar33;
    adStack_98[1] = dVar42;
    adStack_98[lVar22 * 4 + 1] = dVar36;
    auVar38 = *(undefined1 (*) [16])(local_128 + lVar18);
    _local_128 = auVar38;
    *(undefined8 *)(local_128 + lVar18) = 0x3ff0000000000000;
    *(undefined8 *)(local_128 + lVar18 + 8) = 0;
    auVar35 = *(undefined1 (*) [16])(local_118 + lVar18);
    _local_118 = auVar35;
    *(undefined8 *)(local_118 + lVar18) = 0;
    *(undefined8 *)(local_118 + lVar18 + 8) = 0;
  }
  bVar25 = iVar21 != 0;
  iVar21 = (int)uVar24;
  lVar22 = (long)iVar21;
  if (iVar21 != 0) {
    local_a8 = (double)(&local_a8)[lVar22];
    (&local_a8)[lVar22] = CONCAT44(uVar32,uVar31);
    dVar33 = adStack_98[2];
    adStack_98[2] = adStack_98[lVar22 + 2];
    adStack_98[lVar22 + 2] = dVar33;
    dVar33 = local_68[0];
    local_68[0] = local_68[lVar22];
    local_68[lVar22] = dVar33;
    dVar33 = local_48[0];
    local_48[0] = local_48[lVar22];
    local_48[lVar22] = dVar33;
    bVar25 = !bVar25;
  }
  dVar33 = adStack_98[2];
  iVar16 = 0;
  if (0.0 < dVar30) {
    uVar31 = SUB84(local_a8,0);
    uVar32 = (undefined4)((ulong)local_a8 >> 0x20);
    auVar12._4_4_ = uStack_a0._4_4_;
    auVar12._0_4_ = (undefined4)uStack_a0;
    auVar12._8_8_ = adStack_98[0];
    auVar43._8_4_ = uVar31;
    auVar43._0_8_ = local_a8;
    auVar43._12_4_ = uVar32;
    auVar43 = divpd(auVar12,auVar43);
    uStack_a0._0_4_ = auVar43._0_4_;
    uStack_a0._4_4_ = auVar43._4_4_;
    adStack_98[0] = auVar43._8_8_;
    adStack_98[1] = adStack_98[1] / local_a8;
    auVar2._8_4_ = uVar31;
    auVar2._0_8_ = local_a8;
    auVar2._12_4_ = uVar32;
    _local_128 = divpd(auVar38,auVar2);
    auVar38._8_4_ = uVar31;
    auVar38._0_8_ = local_a8;
    auVar38._12_4_ = uVar32;
    _local_118 = divpd(auVar35,auVar38);
    dVar46 = dVar30 * 2.220446049250313e-16;
    dVar41 = auVar43._0_8_;
    dVar37 = local_128;
    dVar39 = local_128._8_8_;
    dVar42 = local_118;
    dVar36 = local_118._8_8_;
    if (dVar46 < ABS(adStack_98[2])) {
      adStack_98[3] = adStack_98[3] - adStack_98[2] * dVar41;
      dVar40 = dStack_78 - adStack_98[2] * adStack_98[0];
      auVar35._8_4_ = SUB84(dVar40,0);
      auVar35._0_8_ = adStack_98[3];
      auVar35._12_4_ = (int)((ulong)dVar40 >> 0x20);
      dStack_78 = auVar35._8_8_;
      dStack_70 = dStack_70 - adStack_98[2] * adStack_98[1];
      local_108._8_8_ = (double)local_108._8_8_ - adStack_98[2] * dVar39;
      local_108._0_8_ = (double)local_108._0_8_ - adStack_98[2] * dVar37;
      dVar40 = (double)local_f8._8_8_ - adStack_98[2] * dVar36;
      local_f8._8_4_ = SUB84(dVar40,0);
      local_f8._0_8_ = (double)local_f8._0_8_ - adStack_98[2] * dVar42;
      local_f8._12_4_ = (int)((ulong)dVar40 >> 0x20);
    }
    dVar40 = adStack_98[3];
    if (dVar46 < ABS(local_68[0])) {
      local_68[1] = local_68[1] - local_68[0] * dVar41;
      local_68[2] = local_68[2] - local_68[0] * adStack_98[0];
      local_68[3] = local_68[3] - local_68[0] * adStack_98[1];
      local_e8._8_8_ = (double)local_e8._8_8_ - local_68[0] * dVar39;
      local_e8._0_8_ = (double)local_e8._0_8_ - local_68[0] * dVar37;
      dVar44 = (double)local_d8._8_8_ - local_68[0] * dVar36;
      local_d8._8_4_ = SUB84(dVar44,0);
      local_d8._0_8_ = (double)local_d8._0_8_ - local_68[0] * dVar42;
      local_d8._12_4_ = (int)((ulong)dVar44 >> 0x20);
    }
    if (dVar46 < ABS(local_48[0])) {
      local_48[1] = local_48[1] - dVar41 * local_48[0];
      auStack_38._8_8_ = (double)auStack_38._8_8_ - adStack_98[1] * local_48[0];
      auStack_38._0_8_ = (double)auStack_38._0_8_ - adStack_98[0] * local_48[0];
      local_c8._8_8_ = (double)local_c8._8_8_ - dVar39 * local_48[0];
      local_c8._0_8_ = (double)local_c8._0_8_ - dVar37 * local_48[0];
      local_b8._8_8_ = (double)local_b8._8_8_ - local_48[0] * dVar36;
      local_b8._0_8_ = (double)local_b8._0_8_ - local_48[0] * dVar42;
    }
    pdVar20 = adStack_98 + 3;
    dVar42 = ABS(adStack_98[3]);
    uVar29 = 1;
    uVar24 = 1;
    uVar28 = 1;
    do {
      uVar26 = 0;
      do {
        pdVar1 = pdVar20 + uVar26;
        uVar26 = uVar26 + 1;
        if (dVar42 < ABS(*pdVar1)) {
          uVar28 = uVar24 & 0xffffffff;
          uVar29 = uVar26 & 0xffffffff;
          dVar42 = ABS(*pdVar1);
        }
      } while (uVar26 != 3);
      uVar24 = uVar24 + 1;
      pdVar20 = pdVar20 + 4;
    } while (uVar24 != 4);
    if (dVar42 < dVar30) {
      *pivot = dVar42;
      dVar30 = dVar42;
    }
    if ((int)uVar28 != 1) {
      lVar18 = (long)(int)uVar28;
      lVar19 = lVar18 * 0x20;
      adStack_98[2] = (double)(&local_a8)[lVar18 * 4];
      adStack_98[3] = *(double *)((long)&uStack_a0 + lVar18 * 8 * 4);
      (&local_a8)[lVar18 * 4] = dVar33;
      *(double *)((long)&uStack_a0 + lVar18 * 8 * 4) = dVar40;
      dVar36 = dStack_70;
      dVar33 = dStack_78;
      dStack_78 = adStack_98[lVar18 * 4];
      dStack_70 = adStack_98[lVar18 * 4 + 1];
      adStack_98[lVar18 * 4] = dVar33;
      adStack_98[lVar18 * 4 + 1] = dVar36;
      uVar11 = local_108._0_8_;
      uVar15 = local_108._8_8_;
      local_108._8_8_ = *(undefined8 *)(local_128 + lVar19 + 8);
      local_108._0_8_ = *(undefined8 *)(local_128 + lVar19);
      *(undefined8 *)(local_128 + lVar19) = uVar11;
      *(undefined8 *)(local_128 + lVar19 + 8) = uVar15;
      uVar11 = local_f8._0_8_;
      uVar15 = local_f8._8_8_;
      local_f8._8_8_ = *(undefined8 *)(local_118 + lVar19 + 8);
      local_f8._0_8_ = *(undefined8 *)(local_118 + lVar19);
      *(undefined8 *)(local_118 + lVar19) = uVar11;
      *(undefined8 *)(local_118 + lVar19 + 8) = uVar15;
      bVar25 = (bool)(bVar25 ^ 1);
    }
    iVar27 = (int)uVar29;
    lVar18 = (long)iVar27;
    if (iVar27 != 1) {
      uVar11 = CONCAT44(uStack_a0._4_4_,(undefined4)uStack_a0);
      uStack_a0._0_4_ = (undefined4)(&local_a8)[lVar18];
      uStack_a0._4_4_ = (undefined4)((ulong)(&local_a8)[lVar18] >> 0x20);
      (&local_a8)[lVar18] = uVar11;
      dVar33 = adStack_98[3];
      adStack_98[3] = adStack_98[lVar18 + 2];
      adStack_98[lVar18 + 2] = dVar33;
      dVar33 = local_68[1];
      local_68[1] = local_68[lVar18];
      local_68[lVar18] = dVar33;
      dVar33 = local_48[1];
      local_48[1] = local_48[lVar18];
      local_48[lVar18] = dVar33;
      bVar25 = (bool)(bVar25 ^ 1);
    }
    dVar36 = local_68[1];
    dVar33 = local_68[0];
    iVar16 = 1;
    if (0.0 < dVar42) {
      dVar37 = (double)CONCAT44(uStack_a0._4_4_,(undefined4)uStack_a0);
      auVar13._8_8_ = dStack_70;
      auVar13._0_8_ = dStack_78;
      auVar48._8_8_ = adStack_98[3];
      auVar48._0_8_ = adStack_98[3];
      auVar34 = divpd(auVar13,auVar48);
      dStack_78 = auVar34._0_8_;
      dStack_70 = auVar34._8_8_;
      local_108 = divpd(local_108,auVar48);
      local_f8 = divpd(local_f8,auVar48);
      dVar42 = dVar42 * 2.220446049250313e-16;
      dVar46 = local_108._0_8_;
      dVar40 = local_108._8_8_;
      dVar39 = local_f8._0_8_;
      dVar41 = local_f8._8_8_;
      if (dVar42 < ABS(dVar37)) {
        adStack_98[0] = adStack_98[0] - dVar37 * dStack_78;
        adStack_98[1] = adStack_98[1] - dVar37 * dStack_70;
        dStack_120 = dStack_120 - dVar37 * dVar40;
        local_128 = (undefined1  [8])((double)local_128 - dVar37 * dVar46);
        dStack_110 = dStack_110 - dVar37 * dVar41;
        local_118 = (undefined1  [8])((double)local_118 - dVar37 * dVar39);
      }
      if (dVar42 < ABS(local_68[1])) {
        local_68[2] = local_68[2] - local_68[1] * dStack_78;
        local_68[3] = local_68[3] - local_68[1] * dStack_70;
        local_e8._8_8_ = (double)local_e8._8_8_ - local_68[1] * dVar40;
        local_e8._0_8_ = (double)local_e8._0_8_ - local_68[1] * dVar46;
        local_d8._8_8_ = (double)local_d8._8_8_ - local_68[1] * dVar41;
        local_d8._0_8_ = (double)local_d8._0_8_ - local_68[1] * dVar39;
      }
      dVar37 = local_68[2];
      auVar35 = local_d8;
      auVar38 = local_e8;
      if (dVar42 < ABS(local_48[1])) {
        dVar42 = (double)auStack_38._8_8_ - local_48[1] * dStack_70;
        auStack_38._8_4_ = SUB84(dVar42,0);
        auStack_38._0_8_ = (double)auStack_38._0_8_ - local_48[1] * dStack_78;
        auStack_38._12_4_ = (int)((ulong)dVar42 >> 0x20);
        local_c8._8_8_ = (double)local_c8._8_8_ - local_48[1] * dVar40;
        local_c8._0_8_ = (double)local_c8._0_8_ - local_48[1] * dVar46;
        dVar42 = (double)local_b8._8_8_ - local_48[1] * dVar41;
        local_b8._8_4_ = SUB84(dVar42,0);
        local_b8._0_8_ = (double)local_b8._0_8_ - local_48[1] * dVar39;
        local_b8._12_4_ = (int)((ulong)dVar42 >> 0x20);
      }
      pdVar20 = local_68 + 2;
      uVar31 = SUB84(local_68[2],0);
      uVar32 = (undefined4)((ulong)local_68[2] >> 0x20);
      dVar42 = ABS(local_68[2]);
      iVar23 = 2;
      uVar29 = 2;
      uVar28 = 2;
      do {
        lVar19 = 0;
        dVar44 = dVar42;
        do {
          dVar42 = ABS(pdVar20[lVar19]);
          if (dVar44 < dVar42) {
            uVar28 = uVar29 & 0xffffffff;
          }
          iVar16 = (int)lVar19 + 2;
          if (dVar42 <= dVar44) {
            dVar42 = dVar44;
            iVar16 = iVar23;
          }
          iVar23 = iVar16;
          lVar19 = lVar19 + 1;
          dVar44 = dVar42;
        } while (lVar19 != 2);
        uVar29 = uVar29 + 1;
        pdVar20 = pdVar20 + 4;
      } while (uVar29 != 4);
      if (dVar42 < dVar30) {
        *pivot = dVar42;
        dVar30 = dVar42;
      }
      if ((int)uVar28 != 2) {
        local_68[0] = local_48[0];
        local_48[0] = dVar33;
        local_68[1] = local_48[1];
        local_48[1] = dVar36;
        uVar31 = auStack_38._0_4_;
        uVar32 = auStack_38._4_4_;
        uVar11 = auStack_38._8_8_;
        local_68[2] = auStack_38._0_8_;
        auStack_38._8_8_ = local_68[3];
        auStack_38._0_8_ = dVar37;
        local_e8 = local_c8;
        local_c8 = auVar38;
        local_d8 = local_b8;
        local_b8 = auVar35;
        bVar25 = (bool)(bVar25 ^ 1);
        local_68[3] = (double)uVar11;
      }
      dVar33 = local_68[3];
      if (iVar23 == 2) {
        auVar34._8_8_ = dStack_78;
        auVar34._0_8_ = dStack_70;
      }
      else {
        auVar3._8_4_ = SUB84(adStack_98[0],0);
        auVar3._0_8_ = adStack_98[1];
        auVar3._12_4_ = (int)((ulong)adStack_98[0] >> 0x20);
        adStack_98[0] = adStack_98[1];
        adStack_98[1] = auVar3._8_8_;
        local_68[3] = (double)CONCAT44(uVar32,uVar31);
        auVar4._8_4_ = auStack_38._0_4_;
        auVar4._0_8_ = auStack_38._8_8_;
        auVar4._12_4_ = auStack_38._4_4_;
        auStack_38 = auVar4;
        bVar25 = (bool)(bVar25 ^ 1);
        uVar31 = SUB84(dVar33,0);
        uVar32 = (undefined4)((ulong)dVar33 >> 0x20);
      }
      dVar33 = auVar34._0_8_;
      dVar36 = auVar34._8_8_;
      iVar16 = 2;
      if (0.0 < dVar42) {
        dVar37 = local_68[3] / (double)CONCAT44(uVar32,uVar31);
        auVar5._8_8_ = CONCAT44(uVar32,uVar31);
        auVar5._0_8_ = CONCAT44(uVar32,uVar31);
        local_e8 = divpd(local_e8,auVar5);
        auVar6._8_8_ = CONCAT44(uVar32,uVar31);
        auVar6._0_8_ = CONCAT44(uVar32,uVar31);
        local_d8 = divpd(local_d8,auVar6);
        dVar42 = dVar42 * 2.220446049250313e-16;
        dVar47 = local_e8._0_8_;
        dVar49 = local_e8._8_8_;
        dVar44 = local_d8._0_8_;
        dVar45 = local_d8._8_8_;
        if (dVar42 < ABS(adStack_98[0])) {
          adStack_98[1] = adStack_98[1] - adStack_98[0] * dVar37;
          dStack_120 = dStack_120 - adStack_98[0] * dVar49;
          local_128 = (undefined1  [8])((double)local_128 - adStack_98[0] * dVar47);
          dStack_110 = dStack_110 - adStack_98[0] * dVar45;
          local_118 = (undefined1  [8])((double)local_118 - adStack_98[0] * dVar44);
        }
        if (dVar42 < ABS(dVar36)) {
          dVar33 = dVar33 - dVar36 * dVar37;
          local_108._0_8_ = dVar46 - dVar36 * dVar47;
          local_108._8_8_ = dVar40 - dVar36 * dVar49;
          local_f8._0_8_ = dVar39 - dVar36 * dVar44;
          local_f8._8_8_ = dVar41 - dVar36 * dVar45;
        }
        if (dVar42 < ABS((double)auStack_38._0_8_)) {
          auStack_38._8_8_ = (double)auStack_38._8_8_ - (double)auStack_38._0_8_ * dVar37;
          local_c8._8_8_ = (double)local_c8._8_8_ - (double)auStack_38._0_8_ * dVar49;
          local_c8._0_8_ = (double)local_c8._0_8_ - (double)auStack_38._0_8_ * dVar47;
          local_b8._8_8_ = (double)local_b8._8_8_ - (double)auStack_38._0_8_ * dVar45;
          local_b8._0_8_ = (double)local_b8._0_8_ - (double)auStack_38._0_8_ * dVar44;
        }
        dVar42 = ABS((double)auStack_38._8_8_);
        if (dVar42 < dVar30) {
          *pivot = dVar42;
        }
        if ((double)auStack_38._8_8_ == 0.0) {
          iVar16 = 3;
        }
        else {
          auVar7._8_8_ = auStack_38._8_8_;
          auVar7._0_8_ = auStack_38._8_8_;
          local_c8 = divpd(local_c8,auVar7);
          auVar8._8_8_ = auStack_38._8_8_;
          auVar8._0_8_ = auStack_38._8_8_;
          local_b8 = divpd(local_b8,auVar8);
          dVar42 = dVar42 * 2.220446049250313e-16;
          dVar39 = local_c8._0_8_;
          dVar41 = local_c8._8_8_;
          dVar30 = local_b8._0_8_;
          dVar36 = local_b8._8_8_;
          if (dVar42 < ABS(adStack_98[1])) {
            dStack_120 = dStack_120 - adStack_98[1] * dVar41;
            local_128 = (undefined1  [8])((double)local_128 - adStack_98[1] * dVar39);
            dStack_110 = dStack_110 - adStack_98[1] * dVar36;
            local_118 = (undefined1  [8])((double)local_118 - adStack_98[1] * dVar30);
          }
          if (dVar42 < ABS(dVar33)) {
            dVar46 = local_108._0_8_;
            local_108._8_8_ = local_108._8_8_ - dVar33 * dVar41;
            local_108._0_8_ = dVar46 - dVar33 * dVar39;
            dVar46 = local_f8._0_8_;
            local_f8._8_8_ = local_f8._8_8_ - dVar33 * dVar36;
            local_f8._0_8_ = dVar46 - dVar33 * dVar30;
          }
          if (dVar42 < ABS(dVar37)) {
            local_e8._8_8_ = dVar49 - dVar41 * dVar37;
            local_e8._0_8_ = dVar47 - dVar39 * dVar37;
            local_d8._8_8_ = dVar45 - dVar37 * dVar36;
            local_d8._0_8_ = dVar44 - dVar37 * dVar30;
          }
          auStack_38._8_8_ =
               (((1.0 / local_a8) / adStack_98[3]) / (double)CONCAT44(uVar32,uVar31)) /
               (double)auStack_38._8_8_;
          if (bVar25) {
            auStack_38._8_8_ = -(double)auStack_38._8_8_;
          }
          *determinant = (double)auStack_38._8_8_;
          iVar16 = 4;
        }
      }
      auVar35 = local_d8;
      auVar38 = local_e8;
      if (iVar23 != 2) {
        local_e8 = local_c8;
        local_c8 = auVar38;
        local_d8 = local_b8;
        local_b8 = auVar35;
      }
    }
    if (iVar27 != 1) {
      lVar18 = lVar18 * 0x20;
      uVar11 = local_108._0_8_;
      uVar15 = local_108._8_8_;
      local_108._8_8_ = *(undefined8 *)(local_128 + lVar18 + 8);
      local_108._0_8_ = *(undefined8 *)(local_128 + lVar18);
      *(undefined8 *)(local_128 + lVar18) = uVar11;
      *(undefined8 *)(local_128 + lVar18 + 8) = uVar15;
      uVar11 = local_f8._0_8_;
      uVar15 = local_f8._8_8_;
      local_f8._8_8_ = *(undefined8 *)(local_118 + lVar18 + 8);
      local_f8._0_8_ = *(undefined8 *)(local_118 + lVar18);
      *(undefined8 *)(local_118 + lVar18) = uVar11;
      *(undefined8 *)(local_118 + lVar18 + 8) = uVar15;
    }
  }
  if (iVar21 != 0) {
    lVar22 = lVar22 * 0x20;
    auVar14 = local_128;
    dVar30 = dStack_120;
    dStack_120 = (double)*(undefined8 *)(local_128 + lVar22 + 8);
    local_128 = (undefined1  [8])*(undefined8 *)(local_128 + lVar22);
    *(undefined1 (*) [8])(local_128 + lVar22) = auVar14;
    *(double *)(local_128 + lVar22 + 8) = dVar30;
    auVar14 = local_118;
    dVar30 = dStack_110;
    dStack_110 = (double)*(undefined8 *)(local_118 + lVar22 + 8);
    local_118 = (undefined1  [8])*(undefined8 *)(local_118 + lVar22);
    *(undefined1 (*) [8])(local_118 + lVar22) = auVar14;
    *(double *)(local_118 + lVar22 + 8) = dVar30;
  }
  pdVar20 = (double *)local_128;
  for (lVar22 = 0x10; lVar22 != 0; lVar22 = lVar22 + -1) {
    (*dst)[0] = *pdVar20;
    pdVar20 = pdVar20 + 1;
    dst = (double (*) [4])((long)dst + 8);
  }
  return iVar16;
}

Assistant:

static int Inv( const double* src, double dst[4][4], double* determinant, double* pivot )
{
  // returns rank (0, 1, 2, 3, or 4), inverse, and smallest pivot

	double M[4][4], I[4][4], x, c, d;
	int i, j, ix, jx;
  int col[4] = {0,1,2,3};
  int swapcount = 0;
  int rank = 0;

  *pivot = 0.0;
  *determinant = 0.0;

  memset( I, 0, sizeof(I) );
  I[0][0] = I[1][1] = I[2][2] = I[3][3] = 1.0;

  memcpy( M, src, sizeof(M) );

  // some loops unrolled for speed

  ix = jx = 0;
	x = fabs(M[0][0]);
  for ( i = 0; i < 4; i++ ) for ( j = 0; j < 4; j++ ) {
    if ( fabs(M[i][j]) > x ) {
      ix = i;
      jx = j;
      x = fabs(M[i][j]);
    }
  }
  *pivot = x;
  if ( ix != 0 ) {
    SwapRow( M, 0, ix );
    SwapRow( I, 0, ix );
    swapcount++;
  }
  if ( jx != 0 ) {
    SwapCol( M, 0, jx );
    col[0] = jx;
    swapcount++;
  }

  if ( x > 0.0 ) {
    rank++;

    // 17 August 2011 Dale Lear
    //   The result is slightly more accurate when using division
    //   instead of multiplying by the inverse of M[0][0]. If there
    //   is any speed penalty at this point in history, the accuracy
    //   is more important than the additional clocks.
    //c = d = 1.0/M[0][0];
    //M[0][1] *= c; M[0][2] *= c; M[0][3] *= c;
    //ScaleRow( I, c, 0 );
    c = M[0][0];
    M[0][1] /= c; M[0][2] /= c; M[0][3] /= c;
    I[0][0] /= c; I[0][1] /= c; I[0][2] /= c; I[0][3] /= c;
    d = 1.0/c;

    x *=  ON_EPSILON;

	  if (fabs(M[1][0]) > x) {
		  c = -M[1][0];
      M[1][1] += c*M[0][1]; M[1][2] += c*M[0][2]; M[1][3] += c*M[0][3];
      AddCxRow( I, c, 0, 1 );
	  }
	  if (fabs(M[2][0]) >  x) {
		  c = -M[2][0];
      M[2][1] += c*M[0][1]; M[2][2] += c*M[0][2]; M[2][3] += c*M[0][3];
      AddCxRow( I, c, 0, 2 );
	  }
	  if (fabs(M[3][0]) >  x) {
		  c = -M[3][0];
      M[3][1] += c*M[0][1]; M[3][2] += c*M[0][2]; M[3][3] += c*M[0][3];
      AddCxRow( I, c, 0, 3 );
	  }

    ix = jx = 1;
	  x = fabs(M[1][1]);
    for ( i = 1; i < 4; i++ ) for ( j = 1; j < 4; j++ ) {
      if ( fabs(M[i][j]) > x ) {
        ix = i;
        jx = j;
        x = fabs(M[i][j]);
      }
    }
    if ( x < *pivot )
      *pivot = x;
    if ( ix != 1 ) {
      SwapRow( M, 1, ix );
      SwapRow( I, 1, ix );
      swapcount++;
    }
    if ( jx != 1 ) {
      SwapCol( M, 1, jx );
      col[1] = jx;
      swapcount++;
    }
    if ( x > 0.0 ) {
      rank++;

      // 17 August 2011 Dale Lear
      //   The result is slightly more accurate when using division
      //   instead of multiplying by the inverse of M[1][1]. If there
      //   is any speed penalty at this point in history, the accuracy
      //   is more important than the additional clocks.
      //c = 1.0/M[1][1];
      //d *= c;
      //M[1][2] *= c; M[1][3] *= c;
      //ScaleRow( I, c, 1 );
      c = M[1][1];
      M[1][2] /= c; M[1][3] /= c;
      I[1][0] /= c; I[1][1] /= c; I[1][2] /= c; I[1][3] /= c;
      d /= c;

      x *= ON_EPSILON;
      if (fabs(M[0][1]) >  x) {
        c = -M[0][1];
        M[0][2] += c*M[1][2]; M[0][3] += c*M[1][3];
        AddCxRow( I, c, 1, 0 );
      }
      if (fabs(M[2][1]) >  x) {
        c = -M[2][1];
        M[2][2] += c*M[1][2]; M[2][3] += c*M[1][3];
        AddCxRow( I, c, 1, 2 );
      }
      if (fabs(M[3][1]) >  x) {
        c = -M[3][1];
        M[3][2] += c*M[1][2]; M[3][3] += c*M[1][3];
        AddCxRow( I, c, 1, 3 );
      }

      ix = jx = 2;
	    x = fabs(M[2][2]);
      for ( i = 2; i < 4; i++ ) for ( j = 2; j < 4; j++ ) {
        if ( fabs(M[i][j]) > x ) {
          ix = i;
          jx = j;
          x = fabs(M[i][j]);
        }
      }
      if ( x < *pivot )
        *pivot = x;
      if ( ix != 2 ) {
        SwapRow( M, 2, ix );
        SwapRow( I, 2, ix );
        swapcount++;
      }
      if ( jx != 2 ) {
        SwapCol( M, 2, jx );
        col[2] = jx;
        swapcount++;
      }
      if ( x > 0.0 ) {
        rank++;

        // 17 August 2011 Dale Lear
        //   The result is slightly more accurate when using division
        //   instead of multiplying by the inverse of M[2][2]. If there
        //   is any speed penalty at this point in history, the accuracy
        //   is more important than the additional clocks.
        //c = 1.0/M[2][2];
        //d *= c;
        //M[2][3] *= c;
        //ScaleRow( I, c, 2 );
        c = M[2][2];
        M[2][3] /= c;
        I[2][0] /= c; I[2][1] /= c; I[2][2] /= c; I[2][3] /= c;
        d /= c;

        x *= ON_EPSILON;
        if (fabs(M[0][2]) >  x) {
          c = -M[0][2];
          M[0][3] += c*M[2][3];
          AddCxRow( I, c, 2, 0 );
        }
        if (fabs(M[1][2]) >  x) {
          c = -M[1][2];
          M[1][3] += c*M[2][3];
          AddCxRow( I, c, 2, 1 );
        }
        if (fabs(M[3][2]) >  x) {
          c = -M[3][2];
          M[3][3] += c*M[2][3];
          AddCxRow( I, c, 2, 3 );
        }

        x = fabs(M[3][3]);
        if ( x < *pivot )
          *pivot = x;

        if ( x > 0.0 ) {
          rank++;

          // 17 August 2011 Dale Lear
          //   The result is slightly more accurate when using division
          //   instead of multiplying by the inverse of M[3][3]. If there
          //   is any speed penalty at this point in history, the accuracy
          //   is more important than the additional clocks.
          //c = 1.0/M[3][3];
          //d *= c;
          //ScaleRow( I, c, 3 );
          c = M[3][3];
          I[3][0] /= c; I[3][1] /= c; I[3][2] /= c; I[3][3] /= c;
          d /= c;

          x *= ON_EPSILON;
          if (fabs(M[0][3]) >  x) {
            AddCxRow( I, -M[0][3], 3, 0 );
          }
          if (fabs(M[1][3]) >  x) {
            AddCxRow( I, -M[1][3], 3, 1 );
          }
          if (fabs(M[2][3]) >  x) {
            AddCxRow( I, -M[2][3], 3, 2 );
          }

          *determinant = (swapcount%2) ? -d : d;
        }
      }
    }
  }

  if ( col[3] != 3 )
    SwapRow( I, 3, col[3] );
  if ( col[2] != 2 )
    SwapRow( I, 2, col[2] );
  if ( col[1] != 1 )
    SwapRow( I, 1, col[1] );
  if ( col[0] != 0 )
    SwapRow( I, 0, col[0] );

  memcpy( dst, I, sizeof(I) );
	return rank;
}